

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLoop.cpp
# Opt level: O1

uint32_t __thiscall
loop::MessageLoop::post_delayed_task(MessageLoop *this,Closure *task,uint32_t delay)

{
  atomic<unsigned_int> *paVar1;
  uint32_t uVar2;
  long lVar3;
  TaskInfo *pTVar4;
  ImplicitProducer *this_00;
  TaskInfo *local_38;
  
  LOCK();
  paVar1 = &this->m_next_id;
  uVar2 = (paVar1->super___atomic_base<unsigned_int>)._M_i;
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  lVar3 = std::chrono::_V2::system_clock::now();
  pTVar4 = (TaskInfo *)operator_new(0x30);
  pTVar4->id = uVar2;
  std::function<void_()>::function(&pTVar4->task,task);
  pTVar4->execute_time = (ulong)delay + lVar3 / 1000000;
  local_38 = pTVar4;
  this_00 = moodycamel::
            ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>
            ::get_or_add_implicit_producer(&this->m_quque);
  if (this_00 != (ImplicitProducer *)0x0) {
    moodycamel::
    ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
    ImplicitProducer::
    enqueue<(moodycamel::ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::AllocationMode)0,loop::MessageLoop::TaskInfo*>
              ((ImplicitProducer *)this_00,&local_38);
  }
  myutils::SharedSemaphore::post(this->m_sem);
  return uVar2;
}

Assistant:

uint32_t MessageLoop::post_delayed_task(const Closure& task, uint32_t delay)
{
    uint32_t id = m_next_id++;
    int64_t time = duration_cast<milliseconds>(system_clock::now().time_since_epoch()).count() + delay;
    m_quque.enqueue(new TaskInfo(id, task, time));
    m_sem->post();
    return id;
}